

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

Script * __thiscall
cfd::core::ScriptBuilder::Build(Script *__return_storage_ptr__,ScriptBuilder *this)

{
  size_t sVar1;
  CfdException *this_00;
  ByteData data;
  ByteData local_58;
  undefined1 local_40 [32];
  
  ByteData::ByteData(&local_58,&this->script_byte_array_);
  sVar1 = ByteData::GetDataSize(&local_58);
  if (sVar1 < 0x2711) {
    Script::Script(__return_storage_ptr__,&local_58);
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_script.cpp";
  local_40._8_4_ = 0x558;
  local_40._16_8_ = "Build";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"Script size is over.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Script size is over.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script ScriptBuilder::Build() {
  ByteData data(script_byte_array_);
  if (data.GetDataSize() > Script::kMaxScriptSize) {
    warn(CFD_LOG_SOURCE, "Script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script size is over.");
  }

  return Script(data);
}